

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeasurementFactory.cpp
# Opt level: O2

MeasurementFactory * MeasurementFactory::GetInstance(void)

{
  if (instance_ != (MeasurementFactory *)0x0) {
    return instance_;
  }
  instance_ = (MeasurementFactory *)operator_new(8);
  instance_->_vptr_MeasurementFactory = (_func_int **)&PTR__MeasurementFactory_0017bb68;
  return instance_;
}

Assistant:

MeasurementFactory *MeasurementFactory::GetInstance() {
    if (instance_ == 0)
	    instance_ = new MeasurementFactory();
    return instance_;
}